

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall
fineftp::FtpSession::sendDirectoryListing
          (FtpSession *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
          *directory_content)

{
  state_type sVar1;
  socket_type sVar2;
  service_type *psVar3;
  error_category *peVar4;
  undefined4 uVar5;
  basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pbVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1117:33),_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  undefined8 uVar8;
  long *in_FS_OFFSET;
  shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  data_socket;
  ptr local_b0;
  basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  local_78;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  local_98 = (basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,std::allocator<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>>,asio::io_context&>
            (&local_90,
             (basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              **)&local_98,
             (allocator<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)&local_88,this->io_service_);
  pbVar6 = local_98;
  local_88 = local_98;
  p_Stack_80 = local_90._M_pi;
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  ::_Rb_tree(&local_78,&directory_content->_M_t);
  ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fineftp::FtpSession,void>
            ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
  psVar3 = (this->data_acceptor_).impl_.service_;
  if (*(long *)(*in_FS_OFFSET + -0x10) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x10) + 8);
  }
  local_b0.h = (anon_class_80_3_18126e9c *)&local_88;
  op = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1117:33),_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                    (uVar8,0xe8);
  p_Var7 = p_Stack_80;
  local_b0.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1117:33),_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  sVar2 = (this->data_acceptor_).impl_.implementation_.super_base_implementation_type.socket_;
  sVar1 = (this->data_acceptor_).impl_.implementation_.super_base_implementation_type.state_;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).super_reactor_op.super_operation.func_ =
       asio::detail::
       reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1117:33),_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).super_reactor_op.super_operation.task_result_ = 0;
  uVar5 = *(undefined4 *)&(psVar3->super_reactive_socket_service_base).success_ec_.field_0x4;
  peVar4 = (psVar3->super_reactive_socket_service_base).success_ec_._M_cat;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).super_reactor_op.ec_._M_value =
       (psVar3->super_reactive_socket_service_base).success_ec_._M_value;
  *(undefined4 *)
   &(op->
    super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
    ).super_reactor_op.ec_.field_0x4 = uVar5;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).super_reactor_op.ec_._M_cat = peVar4;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).super_reactor_op.bytes_transferred_ = 0;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).super_reactor_op.perform_func_ =
       asio::detail::
       reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
       ::do_perform;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).socket_ = sVar2;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).state_ = sVar1;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).new_socket_.socket_ = -1;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).peer_ = pbVar6;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).protocol_.family_ = (this->data_acceptor_).impl_.implementation_.protocol_.family_;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).peer_endpoint_ = (endpoint *)0x0;
  (op->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
  ).addrlen_ = 0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (op->handler_).data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_88;
  (op->handler_).data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7;
  local_88 = (basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)0x0;
  local_b0.v = op;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  ::_Rb_tree(&(op->handler_).directory_content._M_t,&local_78);
  p_Var7 = p_Stack_40;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (op->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48;
  (op->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7;
  local_48 = (element_type *)0x0;
  asio::detail::
  handler_work_base<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_asio::io_context,_asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_asio::io_context,_asio::executor,_void>
                      ,&(this->data_acceptor_).impl_.executor_);
  local_b0.p = op;
  if ((pbVar6->impl_).implementation_.super_base_implementation_type.socket_ == -1) {
    asio::detail::reactive_socket_service_base::start_op
              (&psVar3->super_reactive_socket_service_base,
               &(this->data_acceptor_).impl_.implementation_.super_base_implementation_type,0,
               (reactor_op *)op,false,true,false);
  }
  else {
    ::std::error_code::operator=
              ((error_code *)
               &(op->
                super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp>
                ).super_reactor_op.ec_,already_open);
    asio::detail::scheduler::post_immediate_completion
              (((psVar3->super_reactive_socket_service_base).reactor_)->scheduler_,(operation *)op,
               false);
  }
  local_b0.v = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1117:33),_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_b0.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1117:33),_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  asio::detail::
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1117:33),_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset(&local_b0);
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  ::~_Rb_tree(&local_78);
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  return;
}

Assistant:

void FtpSession::sendDirectoryListing(const std::map<std::string, Filesystem::FileStatus>& directory_content)
  {
    auto data_socket = std::make_shared<asio::ip::tcp::socket>(io_service_);

    data_acceptor_.async_accept(*data_socket
                              , [data_socket, directory_content, me = shared_from_this()](auto ec)
                                {
                                  if (ec)
                                  {
                                    me->sendFtpMessage(FtpReplyCode::TRANSFER_ABORTED, "Data transfer aborted");
                                    return;
                                  }
      // TODO: close acceptor after connect?
                                  // Create a Unix-like file list
                                  std::stringstream stream;
                                  for (const auto& entry : directory_content)
                                  {
                                    const std::string& filename(entry.first);
                                    const fineftp::Filesystem::FileStatus& file_status(entry.second);

                                    stream << ((file_status.type() == fineftp::Filesystem::FileType::Dir) ? 'd' : '-') << file_status.permissionString() << "   1 ";
                                    stream << std::setw(10) << file_status.ownerString() << " " << std::setw(10) << file_status.groupString() << " ";
                                    stream << std::setw(10) << file_status.fileSize() << " ";
                                    stream << file_status.timeString() << " ";
                                    stream << filename;
                                    stream << "\r\n";
                                  }

                                  // Copy the file list into a raw char vector
                                  std::string dir_listing_string = stream.str();
                                  std::shared_ptr<std::vector<char>> dir_listing_rawdata = std::make_shared<std::vector<char>>();
                                  dir_listing_rawdata->reserve(dir_listing_string.size());
                                  std::copy(dir_listing_string.begin(), dir_listing_string.end(), std::back_inserter(*dir_listing_rawdata));

                                  // Send the string out
                                  me->addDataToBufferAndSend(dir_listing_rawdata, data_socket);
                                  me->addDataToBufferAndSend(std::shared_ptr<std::vector<char>>(), data_socket);// Nullpointer indicates end of transmission
                                });
  }